

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegerField.cpp
# Opt level: O3

void __thiscall IntegerField::IntegerField(IntegerField *this,string *name,int size)

{
  pointer pcVar1;
  IntegerElement *pIVar2;
  int iVar3;
  string local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  Tag::Tag(&this->super_Tag,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Tag).super_StreamObject._vptr_StreamObject = (_func_int **)&PTR_write_0010acf8;
  if (size == 0) {
    pIVar2 = (IntegerElement *)operator_new(0x48);
    IntegerElement::IntegerElement(pIVar2);
    Tag::addElement(&this->super_Tag,(StreamObject *)pIVar2);
  }
  else {
    iVar3 = size;
    if (0 < size) {
      do {
        pIVar2 = (IntegerElement *)operator_new(0x48);
        IntegerElement::IntegerElement(pIVar2);
        Tag::addElement(&this->super_Tag,(StreamObject *)pIVar2);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  (this->super_Tag)._lineSize = 1;
  (this->super_Tag)._numberOfLines = size;
  return;
}

Assistant:

IntegerField::IntegerField( std::string name, int size ) : Tag( name )
{
	// we have to add at least one element
	if ( size == 0 )
	{
		addElement( new IntegerElement() );
	}
	else
	{
		for ( int i = 0; i < size; i++ )
		{
			addElement( new IntegerElement() );
		}
	}
	// We want to treat each element
	// as seperate line
	_lineSize = 1;
	_numberOfLines = size;
}